

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
* InferTaprootTree(TaprootSpendData *spenddata,XOnlyPubKey *output)

{
  value_type pTVar1;
  Span<const_unsigned_char> b;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  Span<const_unsigned_char> a;
  Span<const_unsigned_char> script_00;
  initializer_list<TreeNode_*> __l;
  Span<const_unsigned_char> control_00;
  bool bVar2;
  undefined1 uVar3;
  type *ptVar4;
  uint *puVar5;
  size_type sVar6;
  byte *pbVar7;
  reference ppTVar8;
  pointer pTVar9;
  long in_RSI;
  optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  TreeNode *node_1;
  int i;
  bool desc;
  size_t depth;
  size_t levels;
  TreeNode *node;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *control;
  type *__range2;
  type *leaf_ver;
  type *script;
  type *control_blocks;
  type *key;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *__range1;
  vector<TreeNode_*,_std::allocator<TreeNode_*>_> stack;
  iterator __end2;
  iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  ret;
  uint256 hash;
  uint256 merkle_root;
  uint256 leaf_hash;
  TreeNode root;
  optional<std::pair<XOnlyPubKey,_bool>_> tweak;
  pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffcc8;
  type in_stack_fffffffffffffcd0;
  type in_stack_fffffffffffffcd8;
  undefined5 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce5;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  TreeNode *in_stack_fffffffffffffce8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__args_1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  uint8_t in_stack_fffffffffffffcff;
  allocator_type *in_stack_fffffffffffffd00;
  type in_stack_fffffffffffffd08;
  undefined5 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd15;
  undefined1 in_stack_fffffffffffffd16;
  undefined1 in_stack_fffffffffffffd17;
  size_type in_stack_fffffffffffffd18;
  uchar *in_stack_fffffffffffffd20;
  undefined5 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2d;
  undefined1 uVar10;
  int local_288;
  ulong local_268;
  type local_258;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_199;
  unsigned_long local_180;
  allocator_type local_178 [8];
  uchar *local_170;
  uchar *local_168;
  uchar *local_160;
  uchar *local_158;
  _Base_ptr local_130;
  _Base_ptr local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  TreeNode *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  TreeNode local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffcd8);
  XOnlyPubKey::CreateTapTweak
            ((XOnlyPubKey *)
             CONCAT17(in_stack_fffffffffffffd17,
                      CONCAT16(in_stack_fffffffffffffd16,
                               CONCAT15(in_stack_fffffffffffffd15,in_stack_fffffffffffffd10))),
             &in_stack_fffffffffffffd08->hash);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::pair<XOnlyPubKey,_bool>_> *)in_stack_fffffffffffffcc8);
  if (bVar2) {
    std::optional<std::pair<XOnlyPubKey,_bool>_>::operator->
              ((optional<std::pair<XOnlyPubKey,_bool>_> *)in_stack_fffffffffffffcc8);
    bVar2 = XOnlyPubKey::operator!=
                      ((XOnlyPubKey *)in_stack_fffffffffffffcd8,
                       (XOnlyPubKey *)in_stack_fffffffffffffcd0);
    if (!bVar2) {
      std::
      vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ::vector((vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                *)in_stack_fffffffffffffcc8);
      uVar3 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffcd8);
      if ((bool)uVar3) {
        std::
        optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
        ::
        optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true>
                  ((optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                    *)in_stack_fffffffffffffcd8,
                   (vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                    *)in_stack_fffffffffffffcd0);
      }
      else {
        InferTaprootTree::TreeNode::TreeNode(in_stack_fffffffffffffce8);
        local_70.hash.super_base_blob<256U>.m_data._M_elems._0_8_ = *(undefined8 *)(in_RSI + 0x20);
        local_70.hash.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(in_RSI + 0x28);
        local_70.hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)(in_RSI + 0x30);
        local_70.hash.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(in_RSI + 0x38);
        local_118 = (_Base_ptr)
                    std::
                    map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                    ::begin((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffffcd0);
        local_120 = (_Base_ptr)
                    std::
                    map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                    ::end((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                           *)in_stack_fffffffffffffcd0);
        while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffcd8,
                                       (_Self *)in_stack_fffffffffffffcd0),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          std::
          _Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::operator*((_Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)in_stack_fffffffffffffcc8);
          ptVar4 = std::
                   get<0ul,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                             (in_stack_fffffffffffffcc8);
          std::
          get<1ul,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,int>const,std::set<std::vector<unsigned_char,std::allocator<unsigned_char>>,ShortestVectorFirstComparator,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    (in_stack_fffffffffffffcc8);
          std::get<0ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>
                    (&in_stack_fffffffffffffcc8->first);
          puVar5 = (uint *)std::
                           get<1ul,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>
                                     (&in_stack_fffffffffffffcc8->first);
          local_128 = (_Base_ptr)
                      std::
                      set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::begin((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)in_stack_fffffffffffffcd0);
          local_130 = (_Base_ptr)
                      std::
                      set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::end((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)in_stack_fffffffffffffcd0);
          while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffcd8,
                                         (_Self *)in_stack_fffffffffffffcd0),
                ((bVar2 ^ 0xffU) & 1) != 0) {
            std::
            _Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
            operator*((_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)in_stack_fffffffffffffcc8);
            if (((((-1 < (int)*puVar5) && ((int)*puVar5 < 0x100)) && ((*puVar5 & 1) == 0)) &&
                ((sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     in_stack_fffffffffffffcc8), 0x20 < sVar6 &&
                 (sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     in_stack_fffffffffffffcc8), sVar6 < 0x1022)))) &&
               ((sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffcc8), (sVar6 - 0x21 & 0x1f) == 0 &&
                (pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     in_stack_fffffffffffffcd8,(size_type)in_stack_fffffffffffffcd0)
                , (*pbVar7 & 0xfe) == *puVar5)))) {
              uVar10 = (undefined1)*puVar5;
              Span<unsigned_char_const>::
              Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((Span<const_unsigned_char> *)in_stack_fffffffffffffcd8,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              script_00.m_size = (size_t)in_stack_fffffffffffffd08;
              script_00.m_data = (uchar *)in_stack_fffffffffffffd00;
              ComputeTapleafHash(in_stack_fffffffffffffcff,script_00);
              Span<unsigned_char_const>::
              Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((Span<const_unsigned_char> *)in_stack_fffffffffffffcd8,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              control_00.m_size._0_5_ = in_stack_fffffffffffffd28;
              control_00.m_data = in_stack_fffffffffffffd20;
              control_00.m_size._5_1_ = in_stack_fffffffffffffd2d;
              control_00.m_size._6_1_ = uVar10;
              control_00.m_size._7_1_ = uVar3;
              ComputeTaprootMerkleRoot(control_00,&in_stack_fffffffffffffcd8->hash);
              in_stack_fffffffffffffd2d =
                   operator!=((base_blob<256U> *)in_stack_fffffffffffffcd8,
                              (base_blob<256U> *)in_stack_fffffffffffffcd0);
              if (!(bool)in_stack_fffffffffffffd2d) {
                local_258 = &local_70;
                sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffcc8);
                for (local_268 = 0; local_268 < sVar6 - 0x21 >> 5; local_268 = local_268 + 1) {
                  if (((local_258->explored & 1U) != 0) && ((local_258->inner & 1U) == 0)) {
                    std::
                    optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                    ::optional(in_RDI);
                    goto LAB_01a99c10;
                  }
                  uint256::uint256((uint256 *)in_stack_fffffffffffffcc8);
                  local_160 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       begin((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)in_stack_fffffffffffffcd0);
                  in_stack_fffffffffffffd18 = 0x21;
                  local_158 = (uchar *)__gnu_cxx::
                                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       ::operator+((
                                                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_fffffffffffffcd8,
                                                  (difference_type)in_stack_fffffffffffffcd0);
                  __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)in_stack_fffffffffffffcd8,
                              (difference_type)in_stack_fffffffffffffcd0);
                  local_170 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       begin((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)in_stack_fffffffffffffcd0);
                  local_168 = (uchar *)__gnu_cxx::
                                       __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       ::operator+((
                                                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  *)in_stack_fffffffffffffcd8,
                                                  (difference_type)in_stack_fffffffffffffcd0);
                  __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)in_stack_fffffffffffffcd8,
                              (difference_type)in_stack_fffffffffffffcd0);
                  in_stack_fffffffffffffd20 =
                       base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffcc8);
                  __first._M_current._7_1_ = in_stack_fffffffffffffcff;
                  __first._M_current._0_7_ = in_stack_fffffffffffffcf8;
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                            (__first,in_stack_fffffffffffffcf0,(uchar *)in_stack_fffffffffffffcd8);
                  bVar2 = std::unique_ptr::operator_cast_to_bool
                                    ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                     in_stack_fffffffffffffcc8);
                  if (bVar2) {
                    bVar2 = false;
                    for (local_288 = 0; local_288 < 2; local_288 = local_288 + 1) {
                      std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                 in_stack_fffffffffffffcc8);
                      in_stack_fffffffffffffd17 =
                           operator==((base_blob<256U> *)in_stack_fffffffffffffcd8,
                                      (base_blob<256U> *)in_stack_fffffffffffffcd0);
                      if ((bool)in_stack_fffffffffffffd17) {
LAB_01a9953c:
                        pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::
                                 operator->((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                            in_stack_fffffffffffffcc8);
                        *(undefined8 *)((pTVar9->hash).super_base_blob<256U>.m_data._M_elems + 0x10)
                             = local_c0;
                        *(undefined8 *)((pTVar9->hash).super_base_blob<256U>.m_data._M_elems + 0x18)
                             = uStack_b8;
                        *(undefined8 *)(pTVar9->hash).super_base_blob<256U>.m_data._M_elems =
                             local_d0;
                        *(undefined8 *)((pTVar9->hash).super_base_blob<256U>.m_data._M_elems + 8) =
                             uStack_c8;
                        in_stack_fffffffffffffd08 =
                             std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator*
                                       ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                        in_stack_fffffffffffffcd8);
                        bVar2 = true;
                        local_258 = in_stack_fffffffffffffd08;
                        break;
                      }
                      std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                 in_stack_fffffffffffffcc8);
                      in_stack_fffffffffffffd16 =
                           base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffcd8);
                      if ((bool)in_stack_fffffffffffffd16) {
                        std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                  ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                   in_stack_fffffffffffffcc8);
                        in_stack_fffffffffffffd15 =
                             operator!=((base_blob<256U> *)in_stack_fffffffffffffcd8,
                                        (base_blob<256U> *)in_stack_fffffffffffffcd0);
                        if ((bool)in_stack_fffffffffffffd15) goto LAB_01a9953c;
                      }
                    }
                    if (!bVar2) {
                      std::
                      optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                      ::optional(in_RDI);
                      goto LAB_01a99c10;
                    }
                  }
                  else {
                    local_258->explored = true;
                    local_258->inner = true;
                    std::
                    make_unique<InferTaprootTree(TaprootSpendData_const&,XOnlyPubKey_const&)::TreeNode>
                              ();
                    in_stack_fffffffffffffd00 = local_178;
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator=
                              ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                               in_stack_fffffffffffffcd8,
                               (unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                               in_stack_fffffffffffffcd0);
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::~unique_ptr
                              ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                               in_stack_fffffffffffffcd8);
                    std::
                    make_unique<InferTaprootTree(TaprootSpendData_const&,XOnlyPubKey_const&)::TreeNode>
                              ();
                    in_stack_fffffffffffffcf0._M_current = (uchar *)&local_180;
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator=
                              ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                               in_stack_fffffffffffffcd8,
                               (unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                               in_stack_fffffffffffffcd0);
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::~unique_ptr
                              ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                               in_stack_fffffffffffffcd8);
                    pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                       ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                        in_stack_fffffffffffffcc8);
                    *(undefined8 *)((pTVar9->hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
                         local_c0;
                    *(undefined8 *)((pTVar9->hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
                         uStack_b8;
                    *(undefined8 *)(pTVar9->hash).super_base_blob<256U>.m_data._M_elems = local_d0;
                    *(undefined8 *)((pTVar9->hash).super_base_blob<256U>.m_data._M_elems + 8) =
                         uStack_c8;
                    local_258 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator*
                                          ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                           in_stack_fffffffffffffcd8);
                    in_stack_fffffffffffffcf8 = SUB87(local_258,0);
                    in_stack_fffffffffffffcff = (uint8_t)((ulong)local_258 >> 0x38);
                  }
                }
                bVar2 = std::unique_ptr::operator_cast_to_bool
                                  ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                   in_stack_fffffffffffffcc8);
                if (bVar2) {
                  std::
                  optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                  ::optional(in_RDI);
                  goto LAB_01a99c10;
                }
                local_258->explored = true;
                local_258->inner = false;
                local_258->leaf = ptVar4;
                *(undefined8 *)(local_258->hash).super_base_blob<256U>.m_data._M_elems = local_90;
                *(undefined8 *)((local_258->hash).super_base_blob<256U>.m_data._M_elems + 8) =
                     local_88;
                *(undefined8 *)((local_258->hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
                     local_80;
                *(undefined8 *)((local_258->hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
                     local_78;
              }
            }
            std::
            _Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
            operator++((_Rb_tree_const_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffcc8);
          }
          std::
          _Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        *)in_stack_fffffffffffffcc8);
        }
        local_d8 = &local_70;
        __args_1 = &local_199;
        std::allocator<TreeNode_*>::allocator((allocator<TreeNode_*> *)in_stack_fffffffffffffcc8);
        __l._M_array._5_1_ = in_stack_fffffffffffffd15;
        __l._M_array._0_5_ = in_stack_fffffffffffffd10;
        __l._M_array._6_1_ = in_stack_fffffffffffffd16;
        __l._M_array._7_1_ = in_stack_fffffffffffffd17;
        __l._M_len = in_stack_fffffffffffffd18;
        std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::vector
                  ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)in_stack_fffffffffffffd08,__l,
                   in_stack_fffffffffffffd00);
        std::allocator<TreeNode_*>::~allocator((allocator<TreeNode_*> *)in_stack_fffffffffffffcc8);
        while (bVar2 = std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::empty
                                 ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)
                                  in_stack_fffffffffffffcd8), ((bVar2 ^ 0xffU) & 1) != 0) {
          ppTVar8 = std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::back
                              ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)
                               in_stack_fffffffffffffcc8);
          pTVar1 = *ppTVar8;
          if ((pTVar1->explored & 1U) == 0) {
            std::
            optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
            ::optional(in_RDI);
            goto LAB_01a99c03;
          }
          if ((pTVar1->inner & 1U) == 0) {
            std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::size
                      ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)in_stack_fffffffffffffcc8)
            ;
            std::
            vector<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::allocator<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>>
            ::
            emplace_back<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,int_const&>
                      ((vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                        *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                       (unsigned_long *)in_stack_fffffffffffffcf0._M_current,__args_1,
                       (int *)CONCAT17(in_stack_fffffffffffffce7,
                                       CONCAT16(in_stack_fffffffffffffce6,
                                                CONCAT15(in_stack_fffffffffffffce5,
                                                         in_stack_fffffffffffffce0))));
            pTVar1->done = true;
            std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::pop_back
                      ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)in_stack_fffffffffffffcc8)
            ;
          }
          else {
            pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                               ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                in_stack_fffffffffffffcc8);
            in_stack_fffffffffffffce7 = false;
            if ((pTVar9->done & 1U) != 0) {
              pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                 ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                  in_stack_fffffffffffffcc8);
              in_stack_fffffffffffffce7 = false;
              if ((pTVar9->done & 1U) == 0) {
                pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                   ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                    in_stack_fffffffffffffcc8);
                in_stack_fffffffffffffce7 = false;
                if ((pTVar9->explored & 1U) == 0) {
                  std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                            ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                             in_stack_fffffffffffffcc8);
                  in_stack_fffffffffffffce6 =
                       base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffcd8);
                  in_stack_fffffffffffffce7 = false;
                  if (!(bool)in_stack_fffffffffffffce6) {
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                              ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                               in_stack_fffffffffffffcc8);
                    Span<const_unsigned_char>::Span<uint256>
                              ((Span<const_unsigned_char> *)in_stack_fffffffffffffcd8,
                               &in_stack_fffffffffffffcd0->hash,in_stack_fffffffffffffcc8);
                    std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                              ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                               in_stack_fffffffffffffcc8);
                    Span<const_unsigned_char>::Span<uint256>
                              ((Span<const_unsigned_char> *)in_stack_fffffffffffffcd8,
                               &in_stack_fffffffffffffcd0->hash,in_stack_fffffffffffffcc8);
                    a.m_data._7_1_ = in_stack_fffffffffffffcff;
                    a.m_data._0_7_ = in_stack_fffffffffffffcf8;
                    a.m_size = (size_t)in_stack_fffffffffffffd00;
                    b.m_size = (size_t)in_stack_fffffffffffffcf0._M_current;
                    b.m_data = (uchar *)__args_1;
                    ComputeTapbranchHash(a,b);
                    in_stack_fffffffffffffce5 =
                         operator==((base_blob<256U> *)in_stack_fffffffffffffcd8,
                                    (base_blob<256U> *)in_stack_fffffffffffffcd0);
                    in_stack_fffffffffffffce7 = in_stack_fffffffffffffce5;
                  }
                }
              }
            }
            if ((bool)in_stack_fffffffffffffce7 == false) {
              pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                 ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                  in_stack_fffffffffffffcc8);
              if (((pTVar9->done & 1U) == 0) ||
                 (pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                     ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                      in_stack_fffffffffffffcc8), (pTVar9->done & 1U) == 0)) {
                pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                   ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                    in_stack_fffffffffffffcc8);
                if ((pTVar9->done & 1U) == 0) {
                  in_stack_fffffffffffffcd8 =
                       std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator*
                                 ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                  in_stack_fffffffffffffcd8);
                  std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                            ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)
                             in_stack_fffffffffffffcc8,(value_type *)0x1a99b7a);
                }
                else {
                  pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                     ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                      in_stack_fffffffffffffcc8);
                  if ((pTVar9->done & 1U) == 0) {
                    in_stack_fffffffffffffcd0 =
                         std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator*
                                   ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                    in_stack_fffffffffffffcd8);
                    std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                              ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)
                               in_stack_fffffffffffffcc8,(value_type *)0x1a99bd3);
                  }
                }
              }
              else {
                pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                   ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                    in_stack_fffffffffffffcc8);
                pTVar9->done = false;
                pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                   ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                    in_stack_fffffffffffffcc8);
                pTVar9->done = false;
                pTVar1->done = true;
                std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::pop_back
                          ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)
                           in_stack_fffffffffffffcc8);
              }
            }
            else {
              pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                 ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                  in_stack_fffffffffffffcc8);
              pTVar9->done = false;
              pTVar9 = std::unique_ptr<TreeNode,_std::default_delete<TreeNode>_>::operator->
                                 ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)
                                  in_stack_fffffffffffffcc8);
              pTVar9->done = true;
            }
          }
        }
        std::
        optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
        ::
        optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true>
                  ((optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                    *)in_stack_fffffffffffffcd8,
                   (vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                    *)in_stack_fffffffffffffcd0);
LAB_01a99c03:
        std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::~vector
                  ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)in_stack_fffffffffffffcd8);
LAB_01a99c10:
        InferTaprootTree::TreeNode::~TreeNode(in_stack_fffffffffffffcd8);
      }
      std::
      vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ::~vector((vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 *)in_stack_fffffffffffffcd8);
      goto LAB_01a99c4c;
    }
  }
  std::
  optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
  ::optional(in_RDI);
LAB_01a99c4c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::vector<std::tuple<int, std::vector<unsigned char>, int>>> InferTaprootTree(const TaprootSpendData& spenddata, const XOnlyPubKey& output)
{
    // Verify that the output matches the assumed Merkle root and internal key.
    auto tweak = spenddata.internal_key.CreateTapTweak(spenddata.merkle_root.IsNull() ? nullptr : &spenddata.merkle_root);
    if (!tweak || tweak->first != output) return std::nullopt;
    // If the Merkle root is 0, the tree is empty, and we're done.
    std::vector<std::tuple<int, std::vector<unsigned char>, int>> ret;
    if (spenddata.merkle_root.IsNull()) return ret;

    /** Data structure to represent the nodes of the tree we're going to build. */
    struct TreeNode {
        /** Hash of this node, if known; 0 otherwise. */
        uint256 hash;
        /** The left and right subtrees (note that their order is irrelevant). */
        std::unique_ptr<TreeNode> sub[2];
        /** If this is known to be a leaf node, a pointer to the (script, leaf_ver) pair.
         *  nullptr otherwise. */
        const std::pair<std::vector<unsigned char>, int>* leaf = nullptr;
        /** Whether or not this node has been explored (is known to be a leaf, or known to have children). */
        bool explored = false;
        /** Whether or not this node is an inner node (unknown until explored = true). */
        bool inner;
        /** Whether or not we have produced output for this subtree. */
        bool done = false;
    };

    // Build tree from the provided branches.
    TreeNode root;
    root.hash = spenddata.merkle_root;
    for (const auto& [key, control_blocks] : spenddata.scripts) {
        const auto& [script, leaf_ver] = key;
        for (const auto& control : control_blocks) {
            // Skip script records with nonsensical leaf version.
            if (leaf_ver < 0 || leaf_ver >= 0x100 || leaf_ver & 1) continue;
            // Skip script records with invalid control block sizes.
            if (control.size() < TAPROOT_CONTROL_BASE_SIZE || control.size() > TAPROOT_CONTROL_MAX_SIZE ||
                ((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE) != 0) continue;
            // Skip script records that don't match the control block.
            if ((control[0] & TAPROOT_LEAF_MASK) != leaf_ver) continue;
            // Skip script records that don't match the provided Merkle root.
            const uint256 leaf_hash = ComputeTapleafHash(leaf_ver, script);
            const uint256 merkle_root = ComputeTaprootMerkleRoot(control, leaf_hash);
            if (merkle_root != spenddata.merkle_root) continue;

            TreeNode* node = &root;
            size_t levels = (control.size() - TAPROOT_CONTROL_BASE_SIZE) / TAPROOT_CONTROL_NODE_SIZE;
            for (size_t depth = 0; depth < levels; ++depth) {
                // Can't descend into a node which we already know is a leaf.
                if (node->explored && !node->inner) return std::nullopt;

                // Extract partner hash from Merkle branch in control block.
                uint256 hash;
                std::copy(control.begin() + TAPROOT_CONTROL_BASE_SIZE + (levels - 1 - depth) * TAPROOT_CONTROL_NODE_SIZE,
                          control.begin() + TAPROOT_CONTROL_BASE_SIZE + (levels - depth) * TAPROOT_CONTROL_NODE_SIZE,
                          hash.begin());

                if (node->sub[0]) {
                    // Descend into the existing left or right branch.
                    bool desc = false;
                    for (int i = 0; i < 2; ++i) {
                        if (node->sub[i]->hash == hash || (node->sub[i]->hash.IsNull() && node->sub[1-i]->hash != hash)) {
                            node->sub[i]->hash = hash;
                            node = &*node->sub[1-i];
                            desc = true;
                            break;
                        }
                    }
                    if (!desc) return std::nullopt; // This probably requires a hash collision to hit.
                } else {
                    // We're in an unexplored node. Create subtrees and descend.
                    node->explored = true;
                    node->inner = true;
                    node->sub[0] = std::make_unique<TreeNode>();
                    node->sub[1] = std::make_unique<TreeNode>();
                    node->sub[1]->hash = hash;
                    node = &*node->sub[0];
                }
            }
            // Cannot turn a known inner node into a leaf.
            if (node->sub[0]) return std::nullopt;
            node->explored = true;
            node->inner = false;
            node->leaf = &key;
            node->hash = leaf_hash;
        }
    }

    // Recursive processing to turn the tree into flattened output. Use an explicit stack here to avoid
    // overflowing the call stack (the tree may be 128 levels deep).
    std::vector<TreeNode*> stack{&root};
    while (!stack.empty()) {
        TreeNode& node = *stack.back();
        if (!node.explored) {
            // Unexplored node, which means the tree is incomplete.
            return std::nullopt;
        } else if (!node.inner) {
            // Leaf node; produce output.
            ret.emplace_back(stack.size() - 1, node.leaf->first, node.leaf->second);
            node.done = true;
            stack.pop_back();
        } else if (node.sub[0]->done && !node.sub[1]->done && !node.sub[1]->explored && !node.sub[1]->hash.IsNull() &&
                   ComputeTapbranchHash(node.sub[1]->hash, node.sub[1]->hash) == node.hash) {
            // Whenever there are nodes with two identical subtrees under it, we run into a problem:
            // the control blocks for the leaves underneath those will be identical as well, and thus
            // they will all be matched to the same path in the tree. The result is that at the location
            // where the duplicate occurred, the left child will contain a normal tree that can be explored
            // and processed, but the right one will remain unexplored.
            //
            // This situation can be detected, by encountering an inner node with unexplored right subtree
            // with known hash, and H_TapBranch(hash, hash) is equal to the parent node (this node)'s hash.
            //
            // To deal with this, simply process the left tree a second time (set its done flag to false;
            // noting that the done flag of its children have already been set to false after processing
            // those). To avoid ending up in an infinite loop, set the done flag of the right (unexplored)
            // subtree to true.
            node.sub[0]->done = false;
            node.sub[1]->done = true;
        } else if (node.sub[0]->done && node.sub[1]->done) {
            // An internal node which we're finished with.
            node.sub[0]->done = false;
            node.sub[1]->done = false;
            node.done = true;
            stack.pop_back();
        } else if (!node.sub[0]->done) {
            // An internal node whose left branch hasn't been processed yet. Do so first.
            stack.push_back(&*node.sub[0]);
        } else if (!node.sub[1]->done) {
            // An internal node whose right branch hasn't been processed yet. Do so first.
            stack.push_back(&*node.sub[1]);
        }
    }

    return ret;
}